

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLoadStore
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  Expression *pEVar1;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> _Var2;
  undefined4 in_register_0000000c;
  long lVar3;
  char *__s;
  uint in_R8D;
  char *__s_00;
  string *psVar4;
  initializer_list<AssemblyTemplateArgument> variables;
  byte local_164;
  char *local_160;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_150;
  MipsRegisterData *local_148;
  string macroText;
  char *local_120;
  string local_118 [32];
  char *local_f8;
  string local_f0 [32];
  char *local_d0;
  string local_c8 [32];
  char *local_a8;
  string local_a0 [32];
  char *local_80;
  string local_78;
  char *local_58;
  string local_50 [32];
  
  switch(in_R8D & 0x3000f) {
  case 0x10001:
    local_160 = "lb";
    break;
  case 0x10002:
    local_160 = "lbu";
    break;
  case 0x10003:
    local_160 = "lh";
    break;
  case 0x10004:
    local_160 = "lhu";
    break;
  case 0x10005:
    local_160 = "lw";
    break;
  case 0x10006:
    local_160 = "lwu";
    break;
  case 0x10007:
    local_160 = "ld";
    break;
  case 0x10008:
    local_160 = "ll";
    break;
  case 0x10009:
    local_160 = "lld";
    break;
  case 0x1000a:
    local_160 = "lwc1";
    goto LAB_00170732;
  case 0x1000b:
    local_160 = "lwc2";
    goto LAB_00170732;
  case 0x1000c:
    local_160 = "ldc1";
    goto LAB_00170732;
  case 0x1000d:
    local_160 = "ldc2";
LAB_00170732:
    local_164 = 1;
    goto LAB_00170753;
  default:
    switch(in_R8D & 0x3000f) {
    case 0x20001:
      local_160 = "sb";
      break;
    default:
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)parser;
    case 0x20003:
      local_160 = "sh";
      break;
    case 0x20005:
      local_160 = "sw";
      break;
    case 0x20007:
      local_160 = "sd";
      break;
    case 0x20008:
      local_160 = "sc";
      break;
    case 0x20009:
      local_160 = "scd";
      break;
    case 0x2000a:
      local_160 = "swc1";
      goto LAB_00170732;
    case 0x2000b:
      local_160 = "swc2";
      goto LAB_00170732;
    case 0x2000c:
      local_160 = "sdc1";
      goto LAB_00170732;
    case 0x2000d:
      local_160 = "sdc2";
      goto LAB_00170732;
    }
  }
  local_164 = 0;
LAB_00170753:
  local_150._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)parser;
  local_148 = registers;
  preprocessMacro_abi_cxx11_
            (&macroText,
             "\n\t\t.if %imm% & ~0xFFFFFFFF\n\t\t\t.error \"Address too big\"\n\t\t.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(r0)\n\t\t\t.elseif %upper%\n\t\t\t\tnop\n\t\t\t.endif\n\t\t.else\n\t\t\t.if %upper%\n\t\t\t\tlui\t\t%temp%, hi(%imm%)\n\t\t\t.endif\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(%temp%)\n\t\t\t.endif\n\t\t.endif\n\t"
             ,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_120 = "%upper%";
  __s_00 = "1";
  __s = "1";
  if ((in_R8D >> 0xe & 1) == 0) {
    __s = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_118,__s,&local_151);
  local_f8 = "%lower%";
  if (-1 < (short)in_R8D) {
    __s_00 = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_f0,__s_00,&local_152);
  local_d0 = "%rs%";
  pEVar1 = &(immediates->primary).expression;
  psVar4 = (string *)&immediates[1].secondary.value;
  if (local_164 == 0) {
    psVar4 = (string *)pEVar1;
  }
  std::__cxx11::string::string(local_c8,psVar4);
  local_a8 = "%temp%";
  if (((byte)(in_R8D >> 0x11) & 1 | local_164) == 1) {
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"r1",&local_153);
  }
  else {
    std::__cxx11::string::string(local_a0,(string *)pEVar1);
  }
  local_80 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_78,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_58 = "%op%";
  std::__cxx11::string::string<std::allocator<char>>(local_50,local_160,&local_154);
  _Var2._M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       local_150._M_t.
       super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
       super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_120;
  createMacro((Parser *)
              local_150._M_t.
              super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
              super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl,(string *)local_148,
              (int)&local_160 + 0x20,variables);
  lVar3 = 0xd0;
  do {
    std::__cxx11::string::~string(local_118 + lVar3 + -8);
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
         super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLoadStore(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLoadStore = R"(
		.if %imm% & ~0xFFFFFFFF
			.error "Address too big"
		.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000
			.if %lower%
				%op%	%rs%, lo(%imm%)(r0)
			.elseif %upper%
				nop
			.endif
		.else
			.if %upper%
				lui		%temp%, hi(%imm%)
			.endif
			.if %lower%
				%op%	%rs%, lo(%imm%)(%temp%)
			.endif
		.endif
	)";

	const char* op;
	bool isCop = false;
	switch (flags & (MIPSM_ACCESSMASK|MIPSM_LOAD|MIPSM_STORE))
	{
	case MIPSM_LOAD|MIPSM_B:		op = "lb"; break;
	case MIPSM_LOAD|MIPSM_BU:		op = "lbu"; break;
	case MIPSM_LOAD|MIPSM_HW:		op = "lh"; break;
	case MIPSM_LOAD|MIPSM_HWU:		op = "lhu"; break;
	case MIPSM_LOAD|MIPSM_W:		op = "lw"; break;
	case MIPSM_LOAD|MIPSM_WU:		op = "lwu"; break;
	case MIPSM_LOAD|MIPSM_DW:		op = "ld"; break;
	case MIPSM_LOAD|MIPSM_LLSCW:	op = "ll"; break;
	case MIPSM_LOAD|MIPSM_LLSCDW:	op = "lld"; break;
	case MIPSM_LOAD|MIPSM_COP1:		op = "lwc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_COP2:		op = "lwc2"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP1:	op = "ldc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP2:	op = "ldc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_B:		op = "sb"; break;
	case MIPSM_STORE|MIPSM_HW:		op = "sh"; break;
	case MIPSM_STORE|MIPSM_W:		op = "sw"; break;
	case MIPSM_STORE|MIPSM_DW:		op = "sd"; break;
	case MIPSM_STORE|MIPSM_LLSCW:	op = "sc"; break;
	case MIPSM_STORE|MIPSM_LLSCDW:	op = "scd"; break;
	case MIPSM_STORE|MIPSM_COP1:	op = "swc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_COP2:	op = "swc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP1:	op = "sdc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP2:	op = "sdc2"; isCop = true; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateLoadStore,immediates);

	bool store = (flags & MIPSM_STORE) != 0;
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		isCop ? registers.frs.name.string() : registers.grs.name.string() },
			{ "%temp%",	isCop || store ? "r1" : registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%op%",		op },
	});
}